

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

void __thiscall
slang::analysis::ClockInference::ExpansionInstance::ExpansionInstance
          (ExpansionInstance *this,AssertionInstanceExpression *expr,TimingControl *clock)

{
  size_t sVar1;
  CallExpression *this_00;
  KnownSystemName KVar2;
  pointer ptVar3;
  pointer ptVar4;
  long lVar5;
  
  this->expr = expr;
  this->clock = clock;
  this->hasInferredClockArg = false;
  sVar1 = (expr->arguments)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ptVar4 = (expr->arguments)._M_ptr;
    lVar5 = sVar1 * 0x18;
    do {
      if ((ptVar4 == (pointer)0x0) ||
         (ptVar3 = ptVar4,
         *(__index_type *)
          ((long)&(ptVar4->
                  super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                  ).
                  super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                  .
                  super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                  ._M_head_impl.
                  super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                  .
                  super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
          + 8) != '\0')) {
        ptVar3 = (pointer)0x0;
      }
      if (((ptVar3 != (pointer)0x0) &&
          (this_00 = *(CallExpression **)
                      &(ptVar3->
                       super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                       ).
                       super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                       .
                       super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                       ._M_head_impl.
                       super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                       .
                       super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
          , (this_00->super_Expression).kind == Call)) &&
         (KVar2 = ast::CallExpression::getKnownSystemName(this_00), KVar2 == InferredClock)) {
        this->hasInferredClockArg = true;
        return;
      }
      ptVar4 = ptVar4 + 1;
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

ClockInference::ExpansionInstance::ExpansionInstance(const AssertionInstanceExpression& expr,
                                                     const TimingControl* clock) :
    expr(&expr), clock(clock) {

    // Determine if this instance has an inferred clocking default argument.
    for (auto& arg : expr.arguments) {
        if (auto argExpr = std::get_if<const Expression*>(&std::get<1>(arg))) {
            if (ClockInference::isInferredClockCall(**argExpr)) {
                hasInferredClockArg = true;
                break;
            }
        }
    }
}